

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall APowerMorph::EndEffect(APowerMorph *this)

{
  int iVar1;
  AActor *pAVar2;
  player_t *ppVar3;
  
  APowerup::EndEffect(&this->super_APowerup);
  pAVar2 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      ppVar3 = this->Player;
      if (ppVar3 == (player_t *)0x0) {
        return;
      }
      if (ppVar3->health < 1) {
        return;
      }
      if (this->bNoCallUndoMorph == false) {
        iVar1 = ppVar3->morphTics;
        P_UndoPlayerMorph(ppVar3,ppVar3,0,(bool)((byte)((uint)ppVar3->MorphStyle >> 0xd) & 1));
        ppVar3 = this->Player;
        if ((ppVar3 != (player_t *)0x0) && (ppVar3->morphTics != 0)) {
          *(int *)&(this->super_APowerup).super_AInventory.field_0x4dc = ppVar3->morphTics;
          ppVar3->morphTics = iVar1;
          return;
        }
      }
      this->Player = (player_t *)0x0;
      return;
    }
    (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
  }
  if (this->Player == (player_t *)0x0) {
    return;
  }
  __assert_fail("Player == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_artifacts.cpp"
                ,0x79f,"virtual void APowerMorph::EndEffect()");
}

Assistant:

void APowerMorph::EndEffect( )
{
	Super::EndEffect();

	// Abort if owner already destroyed
	if (Owner == NULL)
	{
		assert(Player == NULL);
		return;
	}
	
	// Abort if owner already unmorphed
	if (Player == NULL)
	{
		return;
	}

	// Abort if owner is dead; their Die() method will
	// take care of any required unmorphing on death.
	if (Player->health <= 0)
	{
		return;
	}

	// Unmorph if possible
	if (!bNoCallUndoMorph)
	{
		int savedMorphTics = Player->morphTics;
		P_UndoPlayerMorph (Player, Player, 0, !!(Player->MorphStyle & MORPH_UNDOALWAYS));

		// Abort if unmorph failed; in that case,
		// set the usual retry timer and return.
		if (Player != NULL && Player->morphTics)
		{
			// Transfer retry timeout
			// to the powerup's timer.
			EffectTics = Player->morphTics;
			// Reload negative morph tics;
			// use actual value; it may
			// be in use for animation.
			Player->morphTics = savedMorphTics;
			// Try again some time later
			return;
		}
	}
	// Unmorph suceeded
	Player = NULL;
}